

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

char * BN_bn2dec(BIGNUM *a)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  cbb_st *pcVar4;
  BIGNUM *pBVar5;
  pointer pbVar6;
  bool local_7a;
  size_t local_78;
  size_t len;
  uint8_t *data;
  int i;
  int add_leading_zeros;
  BN_ULONG word;
  UniquePtr<BIGNUM> copy;
  undefined1 local_48 [8];
  ScopedCBB cbb;
  BIGNUM *a_local;
  
  cbb.ctx_.u._24_8_ = a;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48);
  pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48);
  iVar3 = CBB_init(pcVar4,0x10);
  if (iVar3 != 0) {
    pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48);
    iVar3 = CBB_add_u8(pcVar4,'\0');
    if (iVar3 != 0) {
      iVar3 = BN_is_zero((BIGNUM *)cbb.ctx_.u._24_8_);
      if (iVar3 == 0) {
        pBVar5 = BN_dup((BIGNUM *)cbb.ctx_.u._24_8_);
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&word,(pointer)pBVar5);
        bVar2 = std::operator==((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&word,
                                (nullptr_t)0x0);
        if (bVar2) {
          a_local = (BIGNUM *)0x0;
          copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
        }
        else {
          while( true ) {
            pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&word);
            iVar3 = BN_is_zero(pbVar6);
            if (iVar3 != 0) {
              copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 0;
              goto LAB_006f3805;
            }
            pBVar5 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&word);
            _i = BN_div_word(pBVar5,10000000000000000000);
            if (_i == 0xffffffffffffffff) break;
            pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&word);
            iVar3 = BN_is_zero(pbVar6);
            data._4_4_ = (uint)((iVar3 != 0 ^ 0xffU) & 1);
            data._0_4_ = 0;
            while( true ) {
              local_7a = false;
              if ((int)data < 0x13) {
                local_7a = data._4_4_ != 0 || _i != 0;
              }
              if (!local_7a) break;
              pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48)
              ;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = _i;
              iVar3 = CBB_add_u8(pcVar4,SUB161(auVar1 % ZEXT816(10),0) + '0');
              if (iVar3 == 0) {
                a_local = (BIGNUM *)0x0;
                copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
                goto LAB_006f3805;
              }
              _i = _i / 10;
              data._0_4_ = (int)data + 1;
            }
            if (_i != 0) {
              __assert_fail("word == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                            ,0xe6,"char *BN_bn2dec(const BIGNUM *)");
            }
          }
          a_local = (BIGNUM *)0x0;
          copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
        }
LAB_006f3805:
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&word);
        if (copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ != 0) goto LAB_006f38a6;
      }
      else {
        pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48);
        iVar3 = CBB_add_u8(pcVar4,'0');
        if (iVar3 == 0) {
          a_local = (BIGNUM *)0x0;
          copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
          goto LAB_006f38a6;
        }
      }
      iVar3 = BN_is_negative((BIGNUM *)cbb.ctx_.u._24_8_);
      if (iVar3 != 0) {
        pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48);
        iVar3 = CBB_add_u8(pcVar4,'-');
        if (iVar3 == 0) {
          a_local = (BIGNUM *)0x0;
          copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
          goto LAB_006f38a6;
        }
      }
      pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48);
      iVar3 = CBB_finish(pcVar4,(uint8_t **)&len,&local_78);
      if (iVar3 == 0) {
        a_local = (BIGNUM *)0x0;
        copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
      }
      else {
        std::reverse<unsigned_char*>((uchar *)len,(uchar *)(len + local_78));
        a_local = (BIGNUM *)len;
        copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
      }
      goto LAB_006f38a6;
    }
  }
  a_local = (BIGNUM *)0x0;
  copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
LAB_006f38a6:
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_48);
  return (char *)a_local;
}

Assistant:

char *BN_bn2dec(const BIGNUM *a) {
  // It is easier to print strings little-endian, so we assemble it in reverse
  // and fix at the end.
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 16) || //
      !CBB_add_u8(cbb.get(), 0 /* trailing NUL */)) {
    return nullptr;
  }

  if (BN_is_zero(a)) {
    if (!CBB_add_u8(cbb.get(), '0')) {
      return nullptr;
    }
  } else {
    bssl::UniquePtr<BIGNUM> copy(BN_dup(a));
    if (copy == nullptr) {
      return nullptr;
    }

    while (!BN_is_zero(copy.get())) {
      BN_ULONG word = BN_div_word(copy.get(), BN_DEC_CONV);
      if (word == (BN_ULONG)-1) {
        return nullptr;
      }

      const int add_leading_zeros = !BN_is_zero(copy.get());
      for (int i = 0; i < BN_DEC_NUM && (add_leading_zeros || word != 0); i++) {
        if (!CBB_add_u8(cbb.get(), '0' + word % 10)) {
          return nullptr;
        }
        word /= 10;
      }
      assert(word == 0);
    }
  }

  if (BN_is_negative(a) && //
      !CBB_add_u8(cbb.get(), '-')) {
    return nullptr;
  }

  uint8_t *data;
  size_t len;
  if (!CBB_finish(cbb.get(), &data, &len)) {
    return nullptr;
  }

  std::reverse(data, data + len);
  return reinterpret_cast<char *>(data);
}